

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestPhonySelfReferenceIgnored::Run(ParserTestPhonySelfReferenceIgnored *this)

{
  Test *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  Edge *pEVar4;
  Edge *edge;
  Node *local_20;
  Node *node;
  ParserTestPhonySelfReferenceIgnored *pPStack_10;
  int fail_count;
  ParserTestPhonySelfReferenceIgnored *this_local;
  
  pPStack_10 = this;
  node._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse(&this->super_ParserTest,"build a: phony a\n");
  iVar1 = node._4_4_;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 == iVar3) {
    StringPiece::StringPiece((StringPiece *)&edge,"a");
    local_20 = State::LookupNode(&(this->super_ParserTest).state,_edge);
    pEVar4 = Node::in_edge(local_20);
    this_00 = g_current_test;
    bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&pEVar4->inputs_);
    bVar2 = testing::Test::Check
                      (this_00,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x18b,"edge->inputs_.empty()");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceIgnored) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"build a: phony a\n"
));

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_TRUE(edge->inputs_.empty());
}